

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

int symstrcomp(object *left,char *right)

{
  byte *pbVar1;
  byte bVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  
  uVar6 = (uint)left->header >> 2;
  sVar3 = strlen(right);
  uVar4 = (uint)sVar3;
  uVar7 = uVar6;
  if ((int)uVar4 <= (int)uVar6) {
    uVar7 = uVar4;
  }
  uVar5 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar5;
  }
  do {
    if (uVar8 == uVar5) {
      return uVar6 - uVar4;
    }
    bVar2 = *(byte *)((long)&left[1].header + uVar5);
    pbVar1 = (byte *)(right + uVar5);
    uVar5 = uVar5 + 1;
  } while (bVar2 == *pbVar1);
  return (uint)bVar2 - (uint)*pbVar1;
}

Assistant:

int symstrcomp(struct object *left, const char *right)
{
    int leftsize = SIZE(left);
    int rightsize = (int)strlen(right);
    int minsize = leftsize < rightsize ? leftsize : rightsize;
    register int i;

    if (rightsize < minsize) {
        minsize = rightsize;
    }
    for (i = 0; i < minsize; i++) {
        if ((bytePtr(left)[i]) != (unsigned char)(right[i])) {
            return bytePtr(left)[i]-(unsigned char)(right[i]);
        }
    }
    return leftsize - rightsize;
}